

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall
correctness_mul_merge_randomized_Test::TestBody(correctness_mul_merge_randomized_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *in_R9;
  long lVar4;
  AssertionResult gtest_ar_;
  vector<big_integer,_std::allocator<big_integer>_> x;
  big_integer b;
  big_integer a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  internal local_120 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_110;
  AssertHelper local_f0;
  vector<big_integer,_std::allocator<big_integer>_> local_e8;
  vector<big_integer,_std::allocator<big_integer>_> local_d0;
  vector<big_integer,_std::allocator<big_integer>_> local_b8;
  big_integer local_a0;
  big_integer local_68;
  
  iVar3 = 0;
  do {
    local_e8.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar4 = 1000;
    do {
      iVar2 = rand();
      big_integer::big_integer(&local_68,iVar2 + -0x3fffffff + (uint)(iVar2 == 0x3fffffff));
      std::vector<big_integer,_std::allocator<big_integer>_>::emplace_back<big_integer>
                (&local_e8,&local_68);
      big_integer::~big_integer(&local_68);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    std::vector<big_integer,_std::allocator<big_integer>_>::vector(&local_b8,&local_e8);
    anon_unknown.dwarf_be5a::merge_all<big_integer>(&local_68,&local_b8);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&local_b8);
    std::vector<big_integer,_std::allocator<big_integer>_>::vector(&local_d0,&local_e8);
    anon_unknown.dwarf_be5a::merge_all<big_integer>(&local_a0,&local_d0);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&local_d0);
    local_120[0] = (internal)operator==(&local_68,&local_a0);
    local_118.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_120[0]) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_110,local_120,(AssertionResult *)0x1423c5,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                 ,0x2c2,local_110._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_128.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    big_integer::~big_integer(&local_a0);
    big_integer::~big_integer(&local_68);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&local_e8);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  return;
}

Assistant:

TEST(correctness, mul_merge_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<big_integer> x;
        for (size_t i = 0; i != number_of_multipliers; ++i)
            x.push_back(myrand());

        big_integer a = merge_all(x);
        big_integer b = merge_all(x);

        EXPECT_TRUE(a == b);
    }
}